

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

Violation __thiscall
mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>::
ComputeViolation<std::vector<double,std::allocator<double>>>
          (AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>> *this,
          vector<double,_std::allocator<double>_> *x,bool logical)

{
  long lVar1;
  double dVar2;
  double dVar3;
  Violation VVar4;
  Violation VVar5;
  Violation VVar6;
  
  lVar1 = *(long *)(this + 0x30);
  if (lVar1 == 0) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    do {
      dVar2 = *(double *)(*(long *)(this + 0x20) + -8 + lVar1 * 8) *
              (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[*(int *)(*(long *)(this + 0x68) + -4 + lVar1 * 4)] +
              dVar2;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  dVar3 = *(double *)(this + 0x98);
  if (!logical) {
    VVar5.viol_ = dVar3 - dVar2;
    if (dVar3 <= dVar2) {
      dVar3 = dVar2 + -INFINITY;
      if (dVar2 + -INFINITY <= VVar5.viol_) {
        dVar3 = VVar5.viol_;
      }
      VVar6.valX_ = 0.0;
      VVar6.viol_ = dVar3;
      return VVar6;
    }
    VVar5.valX_ = dVar3;
    return VVar5;
  }
  VVar4.valX_ = 1.0;
  VVar4.viol_ = (double)(-(ulong)(dVar2 < dVar3) & 0x3ff0000000000000);
  return VVar4;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }